

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubf3.c
# Opt level: O2

LispPTR N_OP_ubfloat3(int arg3,LispPTR arg2,LispPTR arg1,int alpha)

{
  long lVar1;
  float fVar2;
  
  if ((alpha == 0) && ((arg1 & 0xfff0000) == 0xe0000)) {
    if ((arg2 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)arg2);
    }
    fVar2 = *(float *)(Lisp_world + arg2);
    for (lVar1 = 0; (arg1 & 0xffff) != (uint)lVar1; lVar1 = lVar1 + 1) {
      fVar2 = fVar2 * (float)arg3 + *(float *)((long)(Lisp_world + arg2) + (lVar1 + 1) * 4);
    }
    if ((uint)ABS(fVar2) < 0x7f800000) {
      return (LispPTR)fVar2;
    }
  }
  MachineState.errorexit = 1;
  MachineState.tosvalue = arg1;
  return 0xffffffff;
}

Assistant:

LispPTR N_OP_ubfloat3(int arg3, LispPTR arg2, LispPTR arg1, int alpha) {
  float val;
  float ans;
  float *fptr;
  int degree;
  int ret;
  float flot;

  val = *(float *)&arg3; /* why? */
  if (alpha) ERROR_EXIT(arg1);
  FPCLEAR;
  if ((arg1 & SEGMASK) != S_POSITIVE) ERROR_EXIT(arg1);
  degree = 0xFFFF & arg1;
  fptr = (float *)NativeAligned4FromLAddr(arg2);
  ans = *((float *)fptr);
  while (degree--) ans = (ans * val) + *((float *)(++fptr));
  if (FPTEST(ans)) ERROR_EXIT(arg1); /* relies on contagion of inf, nan? */
  flot = ans;
  ret = *(int *)&flot; /* why? */
  return (ret);
}